

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

void lj_snap_shrink(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  BCReg maxslot;
  BCReg BVar3;
  uint32_t uVar4;
  SnapShot *pSVar5;
  SnapEntry *pSVar6;
  BCReg BVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint8_t udf [257];
  uint8_t local_138 [264];
  
  pSVar5 = (J->cur).snap;
  uVar1 = (J->cur).nsnap;
  uVar2 = pSVar5[(ulong)uVar1 - 1].mapofs;
  pSVar6 = (J->cur).snapmap;
  uVar12 = (ulong)pSVar5[(ulong)uVar1 - 1].nent;
  maxslot = J->maxslot;
  BVar3 = J->baseslot;
  BVar7 = snap_usedef(J,local_138,(BCIns *)(*(ulong *)(pSVar6 + uVar2 + uVar12) >> 8),maxslot);
  if (BVar7 < maxslot) {
    snap_useuv(J->pt,local_138);
  }
  pSVar5[(ulong)uVar1 - 1].nslots = (uint8_t)(maxslot + BVar3);
  if (uVar12 == 0) {
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar10 = pSVar6[uVar2 + uVar9] >> 0x18;
      if ((uVar10 < BVar7 + BVar3) ||
         ((uVar10 < maxslot + BVar3 && (local_138[uVar10 - BVar3] == '\0')))) {
        uVar11 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        pSVar6[uVar2 + uVar11] = pSVar6[uVar2 + uVar9];
      }
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  pSVar5[(ulong)uVar1 - 1].nent = (uint8_t)uVar8;
  uVar10 = pSVar5[(ulong)uVar1 - 1].mapofs;
  uVar4 = (J->cur).nsnapmap;
  for (; (uint)uVar9 <= ~uVar10 + uVar4; uVar9 = (ulong)((uint)uVar9 + 1)) {
    uVar12 = (ulong)uVar8;
    uVar8 = uVar8 + 1;
    pSVar6[uVar2 + uVar12] = pSVar6[(ulong)uVar2 + (uVar9 & 0xffffffff)];
  }
  (J->cur).nsnapmap = uVar8 + pSVar5[(ulong)uVar1 - 1].mapofs;
  return;
}

Assistant:

void lj_snap_shrink(jit_State *J)
{
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  SnapEntry *map = &J->cur.snapmap[snap->mapofs];
  MSize n, m, nlim, nent = snap->nent;
  uint8_t udf[SNAP_USEDEF_SLOTS];
  BCReg maxslot = J->maxslot;
  BCReg baseslot = J->baseslot;
  BCReg minslot = snap_usedef(J, udf, snap_pc(&map[nent]), maxslot);
  if (minslot < maxslot) snap_useuv(J->pt, udf);
  maxslot += baseslot;
  minslot += baseslot;
  snap->nslots = (uint8_t)maxslot;
  for (n = m = 0; n < nent; n++) {  /* Remove unused slots from snapshot. */
    BCReg s = snap_slot(map[n]);
    if (s < minslot || (s < maxslot && udf[s-baseslot] == 0))
      map[m++] = map[n];  /* Only copy used slots. */
  }
  snap->nent = (uint8_t)m;
  nlim = J->cur.nsnapmap - snap->mapofs - 1;
  while (n <= nlim) map[m++] = map[n++];  /* Move PC + frame links down. */
  J->cur.nsnapmap = (uint32_t)(snap->mapofs + m);  /* Free up space in map. */
}